

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopCheck.c
# Opt level: O1

int Hop_ManCheck(Hop_Man_t *p)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  Hop_Obj_t *pHVar4;
  ulong uVar5;
  long lVar6;
  Hop_Obj_t *pGhost;
  char *pcVar7;
  
  lVar2 = (long)p->vPis->nSize;
  if (0 < lVar2) {
    lVar6 = 0;
    do {
      pGhost = (Hop_Obj_t *)p->vPis->pArray[lVar6];
      if (((Hop_Obj_t *)0x1 < pGhost->pFanin0) || ((Hop_Obj_t *)0x1 < pGhost->pFanin1)) {
        pcVar7 = "Hop_ManCheck: The PI node \"%p\" has fanins.\n";
        goto LAB_007e1e30;
      }
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
  }
  lVar2 = (long)p->vPos->nSize;
  if (0 < lVar2) {
    lVar6 = 0;
    do {
      pGhost = (Hop_Obj_t *)p->vPos->pArray[lVar6];
      if (pGhost->pFanin0 < (Hop_Obj_t *)0x2) {
        pcVar7 = "Hop_ManCheck: The PO node \"%p\" has NULL fanin.\n";
        goto LAB_007e1e30;
      }
      if ((Hop_Obj_t *)0x1 < pGhost->pFanin1) {
        pcVar7 = "Hop_ManCheck: The PO node \"%p\" has second fanin.\n";
        goto LAB_007e1e30;
      }
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
  }
  if (0 < p->nTableSize) {
    lVar2 = 0;
    do {
      pGhost = p->pTable[lVar2];
      if (pGhost != (Hop_Obj_t *)0x0) {
        uVar3 = (ulong)pGhost->pFanin0 & 0xfffffffffffffffe;
        if ((uVar3 == 0) || (uVar5 = (ulong)pGhost->pFanin1 & 0xfffffffffffffffe, uVar5 == 0)) {
          pcVar7 = "Hop_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n";
LAB_007e1e30:
          printf(pcVar7,pGhost);
          return 0;
        }
        if (*(int *)(uVar5 + 0x24) <= *(int *)(uVar3 + 0x24)) {
          pcVar7 = "Hop_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n";
          goto LAB_007e1e30;
        }
        pHVar4 = Hop_TableLookup(p,pGhost);
        if (pHVar4 != pGhost) {
          pcVar7 = "Hop_ManCheck: Node \"%p\" is not in the structural hashing table.\n";
          goto LAB_007e1e30;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nTableSize);
  }
  if (p->nCreated - p->nDeleted == p->nObjs[2] + p->nObjs[3] + p->nObjs[4] + p->nObjs[5] + 1) {
    iVar1 = Hop_TableCountEntries(p);
    if (iVar1 == p->nObjs[5] + p->nObjs[4]) {
      return 1;
    }
    pcVar7 = "Hop_ManCheck: The number of nodes in the structural hashing table is wrong.";
  }
  else {
    pcVar7 = "Hop_ManCheck: The number of created nodes is wrong.";
  }
  puts(pcVar7);
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Hop_ManCheck( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pObj2;
    int i;
    // check primary inputs
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( Hop_ObjFanin0(pObj) || Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The PI node \"%p\" has fanins.\n", pObj );
            return 0;
        }
    }
    // check primary outputs
    Hop_ManForEachPo( p, pObj, i )
    {
        if ( !Hop_ObjFanin0(pObj) )
        {
            printf( "Hop_ManCheck: The PO node \"%p\" has NULL fanin.\n", pObj );
            return 0;
        }
        if ( Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The PO node \"%p\" has second fanin.\n", pObj );
            return 0;
        }
    }
    // check internal nodes
    Hop_ManForEachNode( p, pObj, i )
    {
        if ( !Hop_ObjFanin0(pObj) || !Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n", pObj );
            return 0;
        }
        if ( Hop_ObjFanin0(pObj)->Id >= Hop_ObjFanin1(pObj)->Id )
        {
            printf( "Hop_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n", pObj );
            return 0;
        }
        pObj2 = Hop_TableLookup( p, pObj );
        if ( pObj2 != pObj )
        {
            printf( "Hop_ManCheck: Node \"%p\" is not in the structural hashing table.\n", pObj );
            return 0;
        }
    }
    // count the total number of nodes
    if ( Hop_ManObjNum(p) != 1 + Hop_ManPiNum(p) + Hop_ManPoNum(p) + Hop_ManAndNum(p) + Hop_ManExorNum(p) )
    {
        printf( "Hop_ManCheck: The number of created nodes is wrong.\n" );
        return 0;
    }
    // count the number of nodes in the table
    if ( Hop_TableCountEntries(p) != Hop_ManAndNum(p) + Hop_ManExorNum(p) )
    {
        printf( "Hop_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
//    if ( !Hop_ManIsAcyclic(p) )
//        return 0;
    return 1; 
}